

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chan_writec0(opl_channel *channel,Bit8u data)

{
  ushort uVar1;
  byte bVar2;
  opl_channel *channel_00;
  
  channel->fb = data >> 1 & 7;
  bVar2 = data & 1;
  channel->con = bVar2;
  channel->alg = bVar2;
  channel_00 = channel;
  if (channel->chip->newm != '\0') {
    if (channel->chtype == '\x02') {
      channel->alg = channel->pair->con * '\x02' | bVar2 | 4;
      channel->pair->alg = '\b';
    }
    else if (channel->chtype == '\x01') {
      channel_00 = channel->pair;
      channel_00->alg = bVar2 * '\x02' | channel_00->con | 4;
      channel->alg = '\b';
    }
  }
  chan_setupalg(channel_00);
  uVar1 = -(ushort)(channel->chip->newm == '\0');
  channel->chb = (ushort)((int)((uint)data << 0x1a) >> 0x1f) | uVar1;
  channel->cha = uVar1 | (ushort)((int)((uint)data << 0x1b) >> 0x1f);
  return;
}

Assistant:

void chan_writec0(opl_channel *channel, Bit8u data) {
	channel->fb = (data & 0x0e) >> 1;
	channel->con = data & 0x01;
	channel->alg = channel->con;
	if (channel->chip->newm) {
		if (channel->chtype == ch_4op) {
			channel->pair->alg = 0x04 | (channel->con << 1) | (channel->pair->con);
			channel->alg = 0x08;
			chan_setupalg(channel->pair);
		}
		else if (channel->chtype == ch_4op2) {
			channel->alg = 0x04 | (channel->pair->con << 1) | (channel->con);
			channel->pair->alg = 0x08;
			chan_setupalg(channel);
		}
		else {
			chan_setupalg(channel);
		}
	}
	else {
		chan_setupalg(channel);
	}
	if (channel->chip->newm) {
		channel->cha = ((data >> 4) & 0x01) ? ~0 : 0;
		channel->chb = ((data >> 5) & 0x01) ? ~0 : 0;
	}
	else {
		channel->cha = channel->chb = ~0;
	}
}